

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O2

void __thiscall blockfilter_tests::blockfilter_type_names::test_method(blockfilter_type_names *this)

{
  bool bVar1;
  string *psVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  BlockFilterType *pBVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined8 in_stack_fffffffffffffe48;
  BlockFilterType BVar6;
  char *pcVar7;
  lazy_ostream *assertion_descr;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  lazy_ostream local_120;
  undefined1 *local_110;
  char **local_108;
  allocator<char> local_f9;
  assertion_result local_f8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  BlockFilterType filter_type;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  undefined1 local_58 [32];
  long local_38;
  
  BVar6 = (BlockFilterType)((ulong)in_stack_fffffffffffffe48 >> 0x38);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xb5;
  file.m_begin = (iterator)&local_68;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_011480b0;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_80 = "";
  psVar2 = BlockFilterTypeName_abi_cxx11_(BVar6);
  BVar6 = BASIC;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (local_58,&local_88,0xb5,1);
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xb6;
  file_00.m_begin = (iterator)&local_98;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_a8,msg_00
            );
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_011480b0;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_b0 = "";
  psVar2 = BlockFilterTypeName_abi_cxx11_(BVar6);
  pcVar7 = "";
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_58,&local_b8,0xb6,1,2,psVar2,
             "BlockFilterTypeName(static_cast<BlockFilterType>(255))","","\"\"");
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xb9;
  file_01.m_begin = (iterator)&local_d0;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_e0,msg_01
            );
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"basic",&local_f9);
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)BlockFilterTypeByName((string *)local_58,&filter_type);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_108 = &local_130;
  local_130 = "BlockFilterTypeByName(\"basic\", filter_type)";
  local_128 = "";
  assertion_descr = &local_120;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_138 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,assertion_descr,1,0,WARN,(check_type)pcVar7,(size_t)&local_140,0xb9);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xba;
  file_02.m_begin = (iterator)&local_150;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
             msg_02);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_011480b0;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_168 = "";
  local_120._vptr_lazy_ostream =
       (_func_int **)((ulong)local_120._vptr_lazy_ostream & 0xffffffffffffff00);
  pvVar3 = (iterator)0x2;
  pBVar5 = &filter_type;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,BlockFilterType,BlockFilterType>
            (local_58,&local_170,0xba,1,2,pBVar5,"filter_type",assertion_descr,
             "BlockFilterType::BASIC");
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xbc;
  file_03.m_begin = (iterator)&local_180;
  msg_03.m_end = (iterator)pBVar5;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"unknown",&local_f9);
  bVar1 = BlockFilterTypeByName((string *)local_58,&filter_type);
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "!BlockFilterTypeByName(\"unknown\", filter_type)";
  local_128 = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_198 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_120,1,0,WARN,(check_type)assertion_descr,(size_t)&local_1a0,0xbc);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilter_type_names)
{
    BOOST_CHECK_EQUAL(BlockFilterTypeName(BlockFilterType::BASIC), "basic");
    BOOST_CHECK_EQUAL(BlockFilterTypeName(static_cast<BlockFilterType>(255)), "");

    BlockFilterType filter_type;
    BOOST_CHECK(BlockFilterTypeByName("basic", filter_type));
    BOOST_CHECK_EQUAL(filter_type, BlockFilterType::BASIC);

    BOOST_CHECK(!BlockFilterTypeByName("unknown", filter_type));
}